

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall
MT32Emu::RendererImpl<short>::doRenderStreams
          (RendererImpl<short> *this,DACOutputStreams<short> *streams,Bit32u len)

{
  Bit32u BVar1;
  bool bVar2;
  Bit32u BVar3;
  MidiEventQueue *pMVar4;
  MidiEvent *pMVar5;
  uint local_7c;
  uint local_74;
  Bit32s samplesToNextEvent;
  MidiEvent *nextEvent;
  undefined1 local_50 [4];
  Bit32u thisLen;
  DACOutputStreams<short> tmpStreams;
  Bit32u len_local;
  DACOutputStreams<short> *streams_local;
  RendererImpl<short> *this_local;
  
  tmpStreams.reverbWetRight._4_4_ = len;
  memcpy(local_50,streams,0x30);
  for (; tmpStreams.reverbWetRight._4_4_ != 0;
      tmpStreams.reverbWetRight._4_4_ = tmpStreams.reverbWetRight._4_4_ - nextEvent._4_4_) {
    nextEvent._4_4_ = 1;
    bVar2 = Renderer::isAbortingPoly(&this->super_Renderer);
    if (!bVar2) {
      pMVar4 = Renderer::getMidiQueue(&this->super_Renderer);
      pMVar5 = MidiEventQueue::peekMidiEvent(pMVar4);
      if (pMVar5 == (MidiEvent *)0x0) {
        local_74 = 0x1000;
      }
      else {
        BVar1 = pMVar5->timestamp;
        BVar3 = Renderer::getRenderedSampleCount(&this->super_Renderer);
        local_74 = BVar1 - BVar3;
      }
      if ((int)local_74 < 1) {
        if (pMVar5->sysexData == (Bit8u *)0x0) {
          Synth::playMsgNow((this->super_Renderer).synth,(pMVar5->field_1).sysexLength);
          bVar2 = Renderer::isAbortingPoly(&this->super_Renderer);
          if (!bVar2) {
            pMVar4 = Renderer::getMidiQueue(&this->super_Renderer);
            MidiEventQueue::dropMidiEvent(pMVar4);
          }
        }
        else {
          Synth::playSysexNow((this->super_Renderer).synth,pMVar5->sysexData,
                              (pMVar5->field_1).sysexLength);
          pMVar4 = Renderer::getMidiQueue(&this->super_Renderer);
          MidiEventQueue::dropMidiEvent(pMVar4);
        }
      }
      else {
        if (tmpStreams.reverbWetRight._4_4_ < 0x1001) {
          local_7c = tmpStreams.reverbWetRight._4_4_;
        }
        else {
          local_7c = 0x1000;
        }
        nextEvent._4_4_ = local_7c;
        if (local_74 < local_7c) {
          nextEvent._4_4_ = local_74;
        }
      }
    }
    produceStreams(this,(DACOutputStreams<short> *)local_50,nextEvent._4_4_);
    advanceStreams<short>((DACOutputStreams<short> *)local_50,nextEvent._4_4_);
  }
  return;
}

Assistant:

void RendererImpl<Sample>::doRenderStreams(const DACOutputStreams<Sample> &streams, Bit32u len)
{
	DACOutputStreams<Sample> tmpStreams = streams;
	while (len > 0) {
		// We need to ensure zero-duration notes will play so add minimum 1-sample delay.
		Bit32u thisLen = 1;
		if (!isAbortingPoly()) {
			const volatile MidiEventQueue::MidiEvent *nextEvent = getMidiQueue().peekMidiEvent();
			Bit32s samplesToNextEvent = (nextEvent != NULL) ? Bit32s(nextEvent->timestamp - getRenderedSampleCount()) : MAX_SAMPLES_PER_RUN;
			if (samplesToNextEvent > 0) {
				thisLen = len > MAX_SAMPLES_PER_RUN ? MAX_SAMPLES_PER_RUN : len;
				if (thisLen > Bit32u(samplesToNextEvent)) {
					thisLen = samplesToNextEvent;
				}
			} else {
				if (nextEvent->sysexData == NULL) {
					synth.playMsgNow(nextEvent->shortMessageData);
					// If a poly is aborting we don't drop the event from the queue.
					// Instead, we'll return to it again when the abortion is done.
					if (!isAbortingPoly()) {
						getMidiQueue().dropMidiEvent();
					}
				} else {
					synth.playSysexNow(nextEvent->sysexData, nextEvent->sysexLength);
					getMidiQueue().dropMidiEvent();
				}
			}
		}
		produceStreams(tmpStreams, thisLen);
		advanceStreams(tmpStreams, thisLen);
		len -= thisLen;
	}
}